

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

shared_ptr<mocker::ast::Expression> __thiscall
mocker::Parser::primaryExpr(Parser *this,TokIter *iter,TokIter end)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  Token *this_01;
  PosPair p;
  bool bVar1;
  TokenID TVar2;
  element_type *peVar3;
  element_type *this_02;
  mapped_type *pmVar4;
  pointer pTVar5;
  SyntaxError *pSVar6;
  TokIter in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  shared_ptr<mocker::ast::Expression> sVar8;
  pair<mocker::Position,_mocker::Position> local_1b0;
  Token *local_190;
  pair<mocker::Position,_mocker::Position> local_188;
  undefined1 local_159;
  Token *local_158;
  pair<mocker::Position,_mocker::Position> local_150;
  undefined1 local_130 [8];
  Position begPos;
  undefined1 local_118 [8];
  shared_ptr<mocker::ast::NewExpr> res_1;
  undefined1 local_100 [8];
  shared_ptr<mocker::ast::LiteralExpr> res;
  NodeID local_e0;
  size_t local_d8;
  size_t sStack_d0;
  size_t local_c8;
  size_t sStack_c0;
  Parser local_b0;
  undefined1 local_90 [8];
  vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
  args;
  shared_ptr<mocker::ast::Identifier> ident;
  undefined1 local_48 [8];
  shared_ptr<mocker::ast::IdentifierExpr> identExpr;
  GetTokenID local_30;
  GetTokenID id;
  TokIter *iter_local;
  Parser *this_local;
  TokIter end_local;
  shared_ptr<mocker::ast::Expression> *expr;
  
  id.end._M_current = (TokIter)(TokIter)end._M_current;
  GetTokenID::GetTokenID(&local_30,in_RCX);
  identifierExpr((Parser *)local_48,iter,id.end._M_current);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
  if (bVar1) {
    TVar2 = GetTokenID::operator()(&local_30,*id.end._M_current);
    if (TVar2 == LeftParen) {
      __gnu_cxx::
      __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
      ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                    *)id.end._M_current);
      peVar3 = std::
               __shared_ptr_access<mocker::ast::IdentifierExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::ast::IdentifierExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
      std::shared_ptr<mocker::ast::Identifier>::shared_ptr
                ((shared_ptr<mocker::ast::Identifier> *)
                 &args.
                  super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&peVar3->identifier);
      exprList((vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                *)local_90,(Parser *)iter,(TokIter *)id.end._M_current,in_RCX);
      local_b0.pos = *(unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
                       **)id.end._M_current;
      TVar2 = GetTokenID::operator()(&local_30,(TokIter)local_b0.pos);
      if (TVar2 != RightParen) {
        __assert_fail("id(iter) == TokenID::RightParen",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/parse/parser.cpp"
                      ,0xb6,
                      "std::shared_ptr<ast::Expression> mocker::Parser::primaryExpr(TokIter &, TokIter)"
                     );
      }
      __gnu_cxx::
      __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
      ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                    *)id.end._M_current);
      this_01 = iter[2]._M_current;
      this_02 = std::
                __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&args.
                                 super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_e0 = ast::ASTNode::getID(&this_02->super_ASTNode);
      pmVar4 = std::
               unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
               ::operator[]((unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
                             *)this_01,&local_e0);
      local_d8 = (pmVar4->first).line;
      sStack_d0 = (pmVar4->first).col;
      local_c8 = (pmVar4->second).line;
      sStack_c0 = (pmVar4->second).col;
      this_00 = &res.super___shared_ptr<mocker::ast::LiteralExpr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
      std::shared_ptr<mocker::ast::Expression>::shared_ptr
                ((shared_ptr<mocker::ast::Expression> *)this_00,(nullptr_t)0x0);
      p.first.col = sStack_d0;
      p.first.line = local_d8;
      p.second.line = local_c8;
      p.second.col = sStack_c0;
      makeNode<mocker::ast::FuncCallExpr,std::shared_ptr<mocker::ast::Expression>,std::shared_ptr<mocker::ast::Identifier>,std::vector<std::shared_ptr<mocker::ast::Expression>,std::allocator<std::shared_ptr<mocker::ast::Expression>>>>
                (&local_b0,p,(shared_ptr<mocker::ast::Expression> *)iter,
                 (shared_ptr<mocker::ast::Identifier> *)this_00,
                 (vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                  *)&args.
                     super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::shared_ptr<mocker::ast::Expression>::shared_ptr<mocker::ast::FuncCallExpr,void>
                ((shared_ptr<mocker::ast::Expression> *)this,
                 (shared_ptr<mocker::ast::FuncCallExpr> *)&local_b0);
      std::shared_ptr<mocker::ast::FuncCallExpr>::~shared_ptr
                ((shared_ptr<mocker::ast::FuncCallExpr> *)&local_b0);
      std::shared_ptr<mocker::ast::Expression>::~shared_ptr
                ((shared_ptr<mocker::ast::Expression> *)
                 &res.super___shared_ptr<mocker::ast::LiteralExpr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      bVar1 = true;
      std::
      vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
      ::~vector((vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                 *)local_90);
      std::shared_ptr<mocker::ast::Identifier>::~shared_ptr
                ((shared_ptr<mocker::ast::Identifier> *)
                 &args.
                  super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      std::shared_ptr<mocker::ast::Expression>::shared_ptr<mocker::ast::IdentifierExpr,void>
                ((shared_ptr<mocker::ast::Expression> *)this,
                 (shared_ptr<mocker::ast::IdentifierExpr> *)local_48);
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
  }
  std::shared_ptr<mocker::ast::IdentifierExpr>::~shared_ptr
            ((shared_ptr<mocker::ast::IdentifierExpr> *)local_48);
  _Var7._M_pi = extraout_RDX;
  if (!bVar1) {
    literalExpr((Parser *)local_100,iter,id.end._M_current);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_100);
    if (bVar1) {
      std::shared_ptr<mocker::ast::Expression>::shared_ptr<mocker::ast::LiteralExpr,void>
                ((shared_ptr<mocker::ast::Expression> *)this,
                 (shared_ptr<mocker::ast::LiteralExpr> *)local_100);
    }
    std::shared_ptr<mocker::ast::LiteralExpr>::~shared_ptr
              ((shared_ptr<mocker::ast::LiteralExpr> *)local_100);
    _Var7._M_pi = extraout_RDX_00;
    if (!bVar1) {
      newExpr((Parser *)local_118,iter,id.end._M_current);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_118);
      if (bVar1) {
        std::shared_ptr<mocker::ast::Expression>::shared_ptr<mocker::ast::NewExpr,void>
                  ((shared_ptr<mocker::ast::Expression> *)this,
                   (shared_ptr<mocker::ast::NewExpr> *)local_118);
      }
      std::shared_ptr<mocker::ast::NewExpr>::~shared_ptr
                ((shared_ptr<mocker::ast::NewExpr> *)local_118);
      _Var7._M_pi = extraout_RDX_01;
      if (!bVar1) {
        pTVar5 = __gnu_cxx::
                 __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                 ::operator->((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                               *)id.end._M_current);
        Token::position(&local_150,pTVar5);
        local_130 = (undefined1  [8])local_150.first.line;
        begPos.line = local_150.first.col;
        local_158 = *(Token **)id.end._M_current;
        TVar2 = GetTokenID::operator()(&local_30,(TokIter)local_158);
        if (TVar2 == LeftParen) {
          __gnu_cxx::
          __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
          ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                        *)id.end._M_current);
          local_159 = 0;
          expression(this,iter,id.end._M_current);
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
          if (!bVar1) {
            pSVar6 = (SyntaxError *)__cxa_allocate_exception(0x48);
            pTVar5 = __gnu_cxx::
                     __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                     ::operator->((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                                   *)id.end._M_current);
            Token::position(&local_188,pTVar5);
            SyntaxError::SyntaxError(pSVar6,(Position *)local_130,&local_188.second);
            __cxa_throw(pSVar6,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
          }
          local_190 = *(Token **)id.end._M_current;
          TVar2 = GetTokenID::operator()(&local_30,(TokIter)local_190);
          if (TVar2 != RightParen) {
            pSVar6 = (SyntaxError *)__cxa_allocate_exception(0x48);
            pTVar5 = __gnu_cxx::
                     __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                     ::operator->((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                                   *)id.end._M_current);
            Token::position(&local_1b0,pTVar5);
            SyntaxError::SyntaxError(pSVar6,(Position *)local_130,&local_1b0.second);
            __cxa_throw(pSVar6,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
          }
          __gnu_cxx::
          __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
          ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                        *)id.end._M_current);
          _Var7._M_pi = extraout_RDX_03;
        }
        else {
          std::shared_ptr<mocker::ast::Expression>::shared_ptr
                    ((shared_ptr<mocker::ast::Expression> *)this,(nullptr_t)0x0);
          _Var7._M_pi = extraout_RDX_02;
        }
      }
    }
  }
  sVar8.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  sVar8.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::Expression>)
         sVar8.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::Expression> Parser::primaryExpr(TokIter &iter,
                                                     TokIter end) {
  auto id = GetTokenID(end);
  if (auto identExpr = identifierExpr(iter, end)) {
    if (id(iter) != TokenID::LeftParen)
      return identExpr;
    ++iter;
    auto ident = identExpr->identifier;
    auto args = exprList(iter, end);
    assert(id(iter) == TokenID::RightParen);
    ++iter;
    return makeNode<ast::FuncCallExpr>(
        pos[ident->getID()], std::shared_ptr<ast::Expression>(nullptr),
        std::move(ident), std::move(args));
  }
  if (auto res = literalExpr(iter, end))
    return res;
  if (auto res = newExpr(iter, end))
    return res;

  auto begPos = iter->position().first;
  if (id(iter) != TokenID::LeftParen)
    return nullptr;
  ++iter;
  auto expr = expression(iter, end);
  if (!expr)
    throw SyntaxError(begPos, iter->position().second);
  if (id(iter) != TokenID::RightParen)
    throw SyntaxError(begPos, iter->position().second);
  ++iter;
  return expr;
}